

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O3

void __thiscall
ConvexDecomposition::Array<ConvexDecomposition::Plane>::allocate
          (Array<ConvexDecomposition::Plane> *this,int s)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  Plane *__ptr;
  undefined8 uVar4;
  Plane *pPVar5;
  long lVar6;
  long lVar7;
  
  if (s < 1) {
    __assert_fail("s>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                  ,0x5bf,
                  "void ConvexDecomposition::Array<ConvexDecomposition::Plane>::allocate(int) [Type = ConvexDecomposition::Plane]"
                 );
  }
  iVar3 = this->count;
  if (s < iVar3) {
    __assert_fail("s>=count",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                  ,0x5c0,
                  "void ConvexDecomposition::Array<ConvexDecomposition::Plane>::allocate(int) [Type = ConvexDecomposition::Plane]"
                 );
  }
  __ptr = this->element;
  this->array_size = s;
  pPVar5 = (Plane *)malloc((ulong)(uint)s << 4);
  this->element = pPVar5;
  if (pPVar5 == (Plane *)0x0) {
    __assert_fail("element",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                  ,0x5c4,
                  "void ConvexDecomposition::Array<ConvexDecomposition::Plane>::allocate(int) [Type = ConvexDecomposition::Plane]"
                 );
  }
  if (iVar3 < 1) {
    if (__ptr == (Plane *)0x0) {
      return;
    }
  }
  else {
    lVar6 = 0;
    lVar7 = 0;
    do {
      puVar1 = (undefined8 *)((long)&(__ptr->normal).x + lVar6);
      uVar4 = puVar1[1];
      lVar7 = lVar7 + 1;
      puVar2 = (undefined8 *)((long)&(this->element->normal).x + lVar6);
      *puVar2 = *puVar1;
      puVar2[1] = uVar4;
      lVar6 = lVar6 + 0x10;
    } while (lVar7 < this->count);
  }
  free(__ptr);
  return;
}

Assistant:

void Array<Type>::allocate(int s)
{
	assert(s>0);
	assert(s>=count);
	Type *old = element;
	array_size =s;
	element = (Type *) malloc( sizeof(Type)*array_size);
	assert(element);
	for(int i=0;i<count;i++)
	{
		element[i]=old[i];
	}
	if(old)
	{
		free(old);
	}
}